

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::Subtract
          (TPZMatrix<Fad<long_double>_> *this,TPZMatrix<Fad<long_double>_> *A,
          TPZMatrix<Fad<long_double>_> *res)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<Fad<long_double>_> *aBase;
  Fad<long_double> *v;
  TPZMatrix<Fad<long_double>_> *this_01;
  Fad<long_double> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_00000188;
  char *in_stack_00000190;
  int64_t c;
  int64_t r;
  TPZFMatrix<Fad<long_double>_> *resFmat;
  TPZFMatrix<Fad<long_double>_> *aFmat;
  TPZFMatrix<Fad<long_double>_> *thisFmat;
  Fad<long_double> *this_02;
  Fad<long_double> *pFVar7;
  undefined1 local_e8 [48];
  undefined1 local_b8 [32];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined1 local_78 [56];
  long local_40;
  long local_38;
  TPZMatrix<Fad<long_double>_> *local_30;
  Fad<long_double> *local_28;
  TPZMatrix<Fad<long_double>_> *local_20;
  Fad<long_double> *local_18;
  TPZBaseMatrix *local_10;
  TPZFMatrix<Fad<long_double>_> *this_00;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  iVar6 = TPZBaseMatrix::Rows(local_10);
  if (iVar5 == iVar6) {
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(local_10);
    if (iVar5 == iVar6) goto LAB_013403d9;
  }
  Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
LAB_013403d9:
  iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  this_00 = (TPZFMatrix<Fad<long_double>_> *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (this_00 != (TPZFMatrix<Fad<long_double>_> *)CONCAT44(extraout_var_00,iVar4)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<Fad<long double>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<long double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000190,in_stack_00000188);
  }
  (**(code **)(*(long *)&local_18->val_ + 0xf8))(local_18,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    aBase = (TPZMatrix<Fad<long_double>_> *)0x0;
  }
  else {
    aBase = (TPZMatrix<Fad<long_double>_> *)
            __dynamic_cast(in_RDI,&TPZMatrix<Fad<long_double>>::typeinfo,
                           &TPZFMatrix<Fad<long_double>>::typeinfo,0);
  }
  local_20 = aBase;
  if (local_10 == (TPZBaseMatrix *)0x0) {
    v = (Fad<long_double> *)0x0;
  }
  else {
    v = (Fad<long_double> *)
        __dynamic_cast(local_10,&TPZMatrix<Fad<long_double>>::typeinfo,
                       &TPZFMatrix<Fad<long_double>>::typeinfo,0);
  }
  pFVar7 = local_18;
  local_28 = v;
  if (local_18 == (Fad<long_double> *)0x0) {
    this_01 = (TPZMatrix<Fad<long_double>_> *)0x0;
  }
  else {
    this_01 = (TPZMatrix<Fad<long_double>_> *)
              __dynamic_cast(local_18,&TPZMatrix<Fad<long_double>>::typeinfo,
                             &TPZFMatrix<Fad<long_double>>::typeinfo,0);
  }
  local_30 = this_01;
  if ((this_01 == (TPZMatrix<Fad<long_double>_> *)0x0) ||
     ((local_20 != (TPZMatrix<Fad<long_double>_> *)0x0 && (local_28 != (Fad<long_double> *)0x0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,local_18,local_10);
    Storage(this_01);
    Storage(this_01);
    TPZFMatrix<Fad<long_double>_>::operator-=(this_00,aBase);
    TPZFMatrixRef<Fad<long_double>_>::~TPZFMatrixRef((TPZFMatrixRef<Fad<long_double>_> *)0x13407f1);
    TPZFMatrix<Fad<long_double>_>::~TPZFMatrix((TPZFMatrix<Fad<long_double>_> *)0x13407fe);
  }
  else {
    for (local_38 = 0; lVar1 = local_38, iVar5 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar5;
        local_38 = local_38 + 1) {
      for (local_40 = 0; lVar1 = local_40, iVar5 = TPZBaseMatrix::Cols(in_RDI), lVar3 = local_38,
          lVar2 = local_40, lVar1 < iVar5; local_40 = local_40 + 1) {
        this_02 = local_18;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b8);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_e8,local_10,local_38,local_40);
        operator-<Fad<long_double>,_Fad<long_double>,_nullptr>(v,pFVar7);
        Fad<long_double>::Fad<FadBinaryMinus<Fad<long_double>,Fad<long_double>>>
                  ((Fad<long_double> *)this_00,
                   (FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)aBase);
        (**(code **)(*(long *)&this_02->val_ + 0x118))(this_02,lVar3,lVar2,local_78);
        Fad<long_double>::~Fad(this_02);
        FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_> *)this_02);
        Fad<long_double>::~Fad(this_02);
        Fad<long_double>::~Fad(this_02);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}